

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_abstracttxin.cpp
# Opt level: O1

void __thiscall
AbstractTxIn_ConstractorGetterSetter_Test::TestBody::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,AbstractTxIn *actual)

{
  _Alloc_hider lhs;
  undefined8 uVar1;
  bool bVar2;
  uint32_t uVar3;
  char *pcVar4;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_2;
  undefined1 local_e8 [32];
  undefined1 local_c8 [56];
  undefined1 local_90 [56];
  Txid local_58;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_c8,&expect_txid);
  uVar1 = local_c8._0_8_;
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_e8,(AbstractTxIn *)this);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_90,(Txid *)local_e8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_58,"expect_txid.GetHex().c_str()",
             "actual.GetTxid().GetHex().c_str()",(char *)uVar1,(char *)local_90._0_8_);
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  local_e8._0_8_ = &PTR__Txid_007e3348;
  if ((pointer)local_e8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_e8._8_8_,local_e8._24_8_ - local_e8._8_8_);
  }
  if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
    operator_delete((void *)local_c8._0_8_,local_c8._16_8_ + 1);
  }
  if ((char)local_58._vptr_Txid == '\0') {
    testing::Message::Message((Message *)local_c8);
    if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_58.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x20,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if ((long *)local_c8._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_c8._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_c8._0_8_ + 8))();
      }
      local_c8._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  local_90._0_4_ = cfd::core::AbstractTxIn::GetVout((AbstractTxIn *)this);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"expect_index","actual.GetVout()",&expect_index,(uint *)local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if ((pointer)local_c8._8_8_ == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if ((long *)local_90._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_90._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_90,&expect_txid);
  uVar1 = local_90._0_8_;
  cfd::core::AbstractTxIn::GetOutPoint((OutPoint *)local_c8,(AbstractTxIn *)this);
  cfd::core::OutPoint::GetTxid(&local_58,(OutPoint *)local_c8);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_e8,&local_58);
  testing::internal::CmpHelperSTREQ
            (local_38,"expect_txid.GetHex().c_str()",
             "actual.GetOutPoint().GetTxid().GetHex().c_str()",(char *)uVar1,(char *)local_e8._0_8_)
  ;
  if ((AssertHelperData *)local_e8._0_8_ != (AssertHelperData *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  local_58._vptr_Txid = (_func_int **)&PTR__Txid_007e3348;
  if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_58.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_58.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_c8._0_8_ = &PTR__Txid_007e3348;
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_c8._24_8_ - local_c8._8_8_);
  }
  if ((undefined1 *)local_90._0_8_ != local_90 + 0x10) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x23,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if ((undefined **)local_c8._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_c8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_c8._0_8_ + 8))();
      }
      local_c8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetOutPoint((OutPoint *)local_c8,(AbstractTxIn *)this);
  uVar3 = cfd::core::OutPoint::GetVout((OutPoint *)local_c8);
  local_e8._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_90,"expect_index","actual.GetOutPoint().GetVout()",&expect_index,
             (uint *)local_e8);
  local_c8._0_8_ = &PTR__Txid_007e3348;
  if ((pointer)local_c8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_c8._8_8_,local_c8._24_8_ - local_c8._8_8_);
  }
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_c8);
    if ((pointer)local_90._8_8_ == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_90._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x24,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if ((undefined **)local_c8._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_c8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_c8._0_8_ + 8))();
      }
      local_c8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_90 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  uVar3 = cfd::core::AbstractTxIn::GetSequence((AbstractTxIn *)this);
  local_90._0_4_ = uVar3;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_c8,"expect_sequence","actual.GetSequence()",&expect_sequence,
             (uint *)local_90);
  if (local_c8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_90);
    if ((pointer)local_c8._8_8_ == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_c8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x25,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_e8,(Message *)local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_e8);
    if ((long *)local_90._0_8_ != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_90._0_8_ != (long *)0x0)) {
        (**(code **)(*(long *)local_90._0_8_ + 8))();
      }
      local_90._0_8_ = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_c8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lhs = expect_script_hex_abi_cxx11_._M_dataplus;
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)local_90,(AbstractTxIn *)this);
  cfd::core::Script::GetScript((Script *)local_c8,(Script *)local_90);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_e8,(Script *)local_c8);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_58,"expect_script_hex.c_str()",
             "actual.GetUnlockingScript().GetScript().GetHex().c_str()",lhs._M_p,
             (char *)local_e8._0_8_);
  if ((AssertHelperData *)local_e8._0_8_ != (AssertHelperData *)(local_e8 + 0x10)) {
    operator_delete((void *)local_e8._0_8_,(ulong)(local_e8._16_8_ + 1));
  }
  cfd::core::Script::~Script((Script *)local_c8);
  cfd::core::Script::~Script((Script *)local_90);
  if ((char)local_58._vptr_Txid == '\0') {
    testing::Message::Message((Message *)local_c8);
    if (local_58.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_58.data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_abstracttxin.cpp"
               ,0x27,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_90,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_90);
    if ((undefined **)local_c8._0_8_ != (undefined **)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((undefined **)local_c8._0_8_ != (undefined **)0x0)) {
        (**(code **)(*(undefined **)local_c8._0_8_ + 8))();
      }
      local_c8._0_8_ = (undefined **)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_58.data_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST(AbstractTxIn, ConstractorGetterSetter) {
  const auto check = [](AbstractTxIn actual) -> void {
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetVout());
    EXPECT_STREQ(expect_txid.GetHex().c_str(),
        actual.GetOutPoint().GetTxid().GetHex().c_str());
    EXPECT_EQ(expect_index, actual.GetOutPoint().GetVout());
    EXPECT_EQ(expect_sequence, actual.GetSequence());
    EXPECT_STREQ(expect_script_hex.c_str(),
        actual.GetUnlockingScript().GetScript().GetHex().c_str());
  };

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence,
                                       expect_unlocking_script);
    check(actual);
  }

  {
    AbstractTxIn actual = AbstractTxIn(expect_txid, expect_index,
                                       expect_sequence);
    actual.SetUnlockingScript(expect_unlocking_script);
    check(actual);
  }
}